

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O3

int dodip(obj *potion)

{
  short sVar1;
  boolean bVar2;
  char cVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  obj *poVar8;
  char *pcVar9;
  char *pcVar10;
  obj *poVar11;
  bool bVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  int tmp;
  int iVar16;
  ushort uVar17;
  uint uVar18;
  obj **ppot2;
  char *pcVar19;
  obj *poVar20;
  int y;
  int iVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char allowall [2];
  char qbuf [128];
  char buf [256];
  char Your_buf [256];
  char newbuf [256];
  obj *local_430;
  obj *local_428;
  undefined2 local_41c;
  short local_41a;
  char local_418 [128];
  char local_398 [256];
  char local_298 [256];
  undefined4 local_198;
  undefined3 uStack_194;
  obj local_98;
  
  bVar22 = 0;
  local_41c = 0x14;
  if (potion == (obj *)0x0) {
    poVar8 = getobj((char *)&local_41c,"dip",(obj **)0x0);
    if (poVar8 == (obj *)0x0) {
      return 0;
    }
    if (level->locations[u.ux][u.uy].typ == '\x1c') {
      pcVar9 = xname(poVar8);
      pcVar9 = the(pcVar9);
      pcVar10 = simple_typename((int)poVar8->otyp);
      pcVar10 = the(pcVar10);
      pcVar9 = safe_qbuf("",0x18,pcVar9,pcVar10,"this item");
      sprintf(local_418,"Dip %s into the fountain?",pcVar9);
      cVar3 = yn_function(local_418,"yn",'n');
      if (cVar3 == 'y') {
        dipfountain(poVar8);
        return 1;
      }
    }
    else {
      bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
      if ((bVar2 != '\0') || (bVar2 = is_swamp(level,(int)u.ux,(int)u.uy), bVar2 != '\0')) {
        pcVar9 = waterbody_name(u.ux,u.uy);
        pcVar10 = xname(poVar8);
        pcVar10 = the(pcVar10);
        pcVar19 = simple_typename((int)poVar8->otyp);
        pcVar19 = the(pcVar19);
        pcVar10 = safe_qbuf("",0x1d,pcVar10,pcVar19,"this item");
        sprintf(local_418,"Dip %s into the %s?",pcVar10,pcVar9);
        cVar3 = yn_function(local_418,"yn",'n');
        if (cVar3 == 'y') {
          if ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
             ((youmonst.data)->mlet == '\x05')) {
            floating_above(pcVar9);
            return 1;
          }
          if (((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 2) == 0)) &&
             (u.weapon_skills[0x27].skill < '\x02')) {
            rider_cant_reach();
            return 1;
          }
          get_wet(poVar8);
          if (poVar8->otyp == 0x141) {
            useup(poVar8);
            return 1;
          }
          return 1;
        }
      }
    }
    pcVar9 = xname(poVar8);
    pcVar9 = the(pcVar9);
    pcVar10 = simple_typename((int)poVar8->otyp);
    pcVar10 = the(pcVar10);
    pcVar9 = safe_qbuf("",10,pcVar9,pcVar10,"this item");
    sprintf(local_418,"dip %s into",pcVar9);
    potion = getobj("\b",local_418,(obj **)0x0);
    poVar11 = potion;
  }
  else {
    bVar2 = validate_object(potion,"\b","dip into");
    if (bVar2 == '\0') {
      return 0;
    }
    poVar8 = getobj((char *)&local_41c,"dip",(obj **)0x0);
    poVar11 = poVar8;
  }
  if (poVar11 == (obj *)0x0) {
    return 0;
  }
  if ((potion == poVar8) && (potion->quan == 1)) {
    pline("That is a potion bottle, not a Klein bottle!");
    return 0;
  }
  uVar6 = *(uint *)&potion->field_0x4a;
  uVar5 = uVar6 | 0x800000;
  *(uint *)&potion->field_0x4a = uVar5;
  sVar4 = potion->otyp;
  local_430 = poVar8;
  local_428 = potion;
  if ((long)sVar4 != 0x14f) {
    if ((sVar4 == 0x13a) || (sVar1 = poVar8->otyp, sVar1 == 0x13a)) {
      ppot2 = &local_430;
      iVar7 = dip_diluted_same_potions(&local_428,ppot2);
      if (iVar7 != 0) {
        *(uint *)&local_428->field_0x4a = *(uint *)&local_428->field_0x4a & 0xff7fffff;
        poVar8 = local_428;
LAB_00221dd3:
        prinv((char *)0x0,poVar8,0);
        return 1;
      }
      uVar17 = local_430->otyp;
      auVar23 = pshuflw(ZEXT216(uVar17),ZEXT216(uVar17),0);
      auVar24._0_2_ = -(ushort)(auVar23._0_2_ == 0x1c9);
      auVar24._2_2_ = -(ushort)(auVar23._0_2_ == 0x1c9);
      auVar24._4_2_ = -(ushort)(auVar23._2_2_ == local_428->otyp);
      auVar24._6_2_ = -(ushort)(auVar23._2_2_ == local_428->otyp);
      auVar24._8_2_ = -(ushort)(auVar23._4_2_ == 0x19e);
      auVar24._10_2_ = -(ushort)(auVar23._4_2_ == 0x19e);
      auVar24._12_2_ = -(ushort)(auVar23._6_2_ == 0xcf);
      auVar24._14_2_ = -(ushort)(auVar23._6_2_ == 0xcf);
      iVar7 = movmskps((int)ppot2,auVar24);
      if (((iVar7 == 0) && (local_430 != uball)) && (local_430 != uskin)) {
        poVar8 = local_430;
        if (uVar17 == 0x13a) {
          poVar8 = local_428;
        }
        bVar2 = obj_resists(poVar8,5,0x5f);
        poVar11 = local_430;
        poVar8 = uquiver;
        if (bVar2 == '\0') {
          sVar4 = local_430->otyp;
          u.uconduct.polypiles = u.uconduct.polypiles + 1;
          if (local_430 == uwep) {
            local_430 = poly_obj(local_430,0);
            setuwep(local_430);
          }
          else if (local_430 == uswapwep) {
            local_430 = poly_obj(local_430,0);
            setuswapwep(local_430);
          }
          else {
            local_430 = poly_obj(local_430,0);
            if (poVar11 == poVar8) {
              setuqwep(local_430);
            }
          }
          if (local_430->otyp != sVar4) {
            discover_object(0x13a,'\x01','\x01');
            useup(local_428);
            poVar8 = local_430;
            goto LAB_00221dd3;
          }
          pline("Nothing seems to happen.");
          goto LAB_00222068;
        }
      }
      pline("Nothing happens.");
      goto LAB_00222009;
    }
    if ((sVar1 == sVar4) || (poVar8->oclass != '\b')) {
      iVar7 = dip_diluted_same_potions(&local_428,&local_430);
      if (iVar7 != 0) {
        local_428->field_0x4c = local_428->field_0x4c & 0x7f;
        poVar8 = local_428;
        goto LAB_00221dd3;
      }
      goto LAB_00221e64;
    }
    if (((uVar6 & 0x20) == 0) || ((poVar8->field_0x4a & 0x20) == 0)) {
      pline("The potions mix...");
    }
    else {
      pline("You mix the %s potion with the %s one ...",
            obj_descr[objects[sVar4].oc_descr_idx].oc_descr,
            obj_descr[objects[sVar1].oc_descr_idx].oc_descr);
    }
    if (((((poVar8->field_0x4a & 1) != 0) || (poVar8->otyp == 0x141)) || (potion->otyp == 0x141)) ||
       (uVar6 = mt_random(),
       (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a)) {
      pline("BOOM!  They explode!");
      exercise(0,'\0');
      if ((~(youmonst.data)->mflags1 & 0x1400) != 0) {
        potionbreathe(poVar8);
      }
      useup(poVar8);
      useup(potion);
      bVar12 = (youmonst.mintrinsics & 0x40) == 0 && u.uprops[7].extrinsic == 0;
      uVar6 = mt_random();
      losehp(uVar6 % ((uint)bVar12 + (uint)bVar12 * 4 + 5) + 1,"alchemic blast",0);
      return 1;
    }
    uVar6 = *(uint *)&poVar8->field_0x4a & 0xffffffbc;
    *(uint *)&poVar8->field_0x4a = uVar6;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002221a1;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00222198;
LAB_00222ada:
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum != u.umonster) {
          bVar2 = dmgtype(youmonst.data,0x24);
          if (bVar2 != '\0') goto LAB_00222b26;
          uVar6 = *(uint *)&poVar8->field_0x4a;
        }
        goto LAB_00222b1f;
      }
    }
    else {
LAB_00222198:
      if (ublindf != (obj *)0x0) {
LAB_002221a1:
        if (ublindf->oartifact == '\x1d') goto LAB_00222ada;
      }
LAB_00222b1f:
      *(uint *)&poVar8->field_0x4a = uVar6 & 0xffffffdf;
    }
LAB_00222b26:
    sVar4 = mixtype(poVar8,potion);
    if (sVar4 == 0) {
      uVar6 = *(uint *)&poVar8->field_0x4a;
      if ((uVar6 & 0x300) == 0) {
        uVar6 = mt_random();
        uVar6 = uVar6 & 7;
        if (uVar6 - 1 < 2) {
          poVar8->otyp = 0x13f;
          *(uint *)&poVar8->field_0x4a = *(uint *)&poVar8->field_0x4a & 0xfffffcff | 0x100;
          goto LAB_00222e17;
        }
        if (uVar6 == 3) {
          poVar11 = mkobj(level,'\b','\0');
          poVar8->otyp = poVar11->otyp;
          obfree(poVar11,(obj *)0x0);
          sVar4 = poVar8->otyp;
          goto LAB_00222b3b;
        }
        if (uVar6 == 0) {
          uVar6 = *(uint *)&poVar8->field_0x4a;
          goto LAB_00222b75;
        }
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00222f31;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00222f2c;
LAB_00222f57:
          pline("The mixture glows brightly and evaporates.");
        }
        else {
LAB_00222f2c:
          if (ublindf != (obj *)0x0) {
LAB_00222f31:
            if (ublindf->oartifact == '\x1d') goto LAB_00222f57;
          }
        }
        useup(poVar8);
        goto LAB_002227c5;
      }
LAB_00222b75:
      poVar8->otyp = 0x14f;
      *(uint *)&poVar8->field_0x4a = uVar6 & 0xfffffcff;
LAB_00222b85:
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0'))))
      goto LAB_00222e17;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00222be9;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00222be0;
        pcVar9 = ", then clears";
      }
      else {
LAB_00222be0:
        if (ublindf == (obj *)0x0) {
          pcVar9 = "";
        }
        else {
LAB_00222be9:
          pcVar9 = "";
          if (ublindf->oartifact == '\x1d') {
            pcVar9 = ", then clears";
          }
        }
      }
      pcVar10 = "The mixture bubbles%s.";
    }
    else {
      poVar8->otyp = sVar4;
LAB_00222b3b:
      *(uint *)&poVar8->field_0x4a =
           *(uint *)&poVar8->field_0x4a & 0xfffffcff | (uint)(sVar4 != 0x14f) << 8;
      if (sVar4 == 0x14f) goto LAB_00222b85;
LAB_00222e17:
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00222e2a;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00222e25;
      }
      else {
LAB_00222e25:
        if (ublindf == (obj *)0x0) goto LAB_00222e8f;
LAB_00222e2a:
        if (ublindf->oartifact != '\x1d') goto LAB_00222e8f;
      }
      pcVar9 = hcolor(obj_descr[objects[poVar8->otyp].oc_descr_idx].oc_descr);
      pcVar10 = "The mixture looks %s.";
    }
    pline(pcVar10,pcVar9);
LAB_00222e8f:
    useup(potion);
    poVar8->quan = poVar8->quan + 1;
    uVar6 = weight(poVar8);
    poVar8->owt = uVar6;
    return 1;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00221c29;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00221c20;
LAB_00221cd9:
    Shk_Your(local_298,poVar8);
    uVar5 = *(uint *)&local_428->field_0x4a;
    bVar12 = false;
  }
  else {
LAB_00221c20:
    if (ublindf == (obj *)0x0) {
      bVar12 = true;
    }
    else {
LAB_00221c29:
      bVar12 = true;
      if (ublindf->oartifact == '\x1d') goto LAB_00221cd9;
    }
  }
  if ((uVar5 & 2) == 0) {
    if ((uVar5 & 1) != 0) {
      if ((*(uint *)&local_430->field_0x4a & 2) == 0) {
        if ((*(uint *)&local_430->field_0x4a & 1) != 0) goto LAB_00221e64;
        if (!bVar12) {
          pcVar9 = hcolor("black");
          pcVar10 = aobjnam(local_430,"glow");
          pcVar19 = strchr("aeiouAEIOU",(int)*pcVar9);
          pcVar14 = "n";
          if (pcVar19 == (char *)0x0) {
            pcVar14 = "";
          }
          pline("%s %s with a%s %s aura.",local_298,pcVar10,pcVar14,pcVar9);
        }
        curse(local_430);
      }
      else {
        if (!bVar12) {
          pcVar9 = aobjnam(local_430,"glow");
          pcVar10 = hcolor("brown");
          pline("%s %s %s.",local_298,pcVar9,pcVar10);
        }
        unbless(local_430);
      }
      goto LAB_0022205f;
    }
    bVar2 = get_wet(local_430);
    if (bVar2 == '\0') {
LAB_00221e64:
      uVar17 = local_428->otyp;
      if (((uVar17 == 0x141) && (local_430->otyp == 0x10e)) && (local_430->corpsenm == 0xa3)) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00221ea9;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00221ea4;
LAB_00222608:
          pcVar9 = cxname(local_430);
          pcVar9 = The(pcVar9);
          pcVar10 = otense(local_430,"turn");
          pcVar19 = "orange";
          if ((*(uint *)&local_428->field_0x4a & 0x300) == 0) {
            pcVar19 = "red";
          }
          pline("%s %s %s around the edges.",pcVar9,pcVar10,pcVar19);
LAB_00222009:
          *(uint *)&local_428->field_0x4a = *(uint *)&local_428->field_0x4a & 0xff7fffff;
          return 1;
        }
LAB_00221ea4:
        if (ublindf != (obj *)0x0) {
LAB_00221ea9:
          if (ublindf->oartifact == '\x1d') goto LAB_00222608;
        }
      }
      cVar3 = local_430->oclass;
      if ((cVar3 != '\x02') || (4 < (byte)(objects[local_430->otyp].oc_subtyp + 0x1aU))) {
LAB_00222245:
        if (uVar17 != 0x142) {
LAB_00222418:
          uVar6 = *(uint *)&local_428->field_0x4a;
LAB_0022241b:
          *(uint *)&local_428->field_0x4a = uVar6 & 0xff7fffff;
          if (((local_430->otyp != 0x200) && (local_430->otyp != 0x10a)) ||
             (sVar4 = mixtype(local_430,local_428), sVar4 == 0)) {
            pline("Interesting...");
            return 1;
          }
          sVar1 = local_428->otyp;
          iVar7 = local_428->quan;
          local_398[0] = '\0';
          uVar6 = *(uint *)&local_428->field_0x4a;
          iVar16 = iVar7;
          local_41a = sVar1;
          if ((uVar6 & 0x20) != 0) {
            pcVar9 = hcolor(obj_descr[objects[sVar1].oc_descr_idx].oc_descr);
            sprintf(local_398,"%s ",pcVar9);
            iVar16 = local_428->quan;
          }
          poVar8 = local_428;
          if (1 < iVar16) {
            poVar8 = splitobj(local_428,1);
          }
          if (((poVar8->field_0x4a & 4) != 0) && (bVar2 = costly_spot(u.ux,u.uy), bVar2 != '\0')) {
            pline("You use it, you pay for it.");
            bill_dummy_object(poVar8);
          }
          poVar8->otyp = sVar4;
          uVar5 = *(uint *)&poVar8->field_0x4a;
          *(uint *)&poVar8->field_0x4a = uVar5 & 0xfffffffd;
          if (sVar4 == 0x14f) {
            uVar5 = uVar5 & 0xfffffcfc;
          }
          else {
            uVar5 = uVar5 & 0xfffffffc | *(uint *)&local_430->field_0x4a & 1;
          }
          uVar13 = uVar5 & 0xffffffbf;
          *(uint *)&poVar8->field_0x4a = uVar13;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00222577;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00222572;
LAB_002225a6:
            uVar18 = 0x20;
            if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_00222985:
              *(uint *)&poVar8->field_0x4a = uVar13 & 0xffffffdf | uVar18;
              if ((sVar4 != 0x14f) || (uVar18 == 0)) goto LAB_002229b2;
              uStack_194 = 0x7372;
              local_198 = 0x61656c63;
            }
            else {
              if (u.umonnum != u.umonster) {
                bVar2 = dmgtype(youmonst.data,0x24);
                uVar18 = (uint)(bVar2 != '\0') << 5;
                uVar13 = *(uint *)&poVar8->field_0x4a;
                goto LAB_00222985;
              }
              *(uint *)&poVar8->field_0x4a = uVar5 & 0xffffff9f;
LAB_002229b2:
              pcVar9 = hcolor(obj_descr[objects[sVar4].oc_descr_idx].oc_descr);
              sprintf((char *)&local_198,"turns %s",pcVar9);
            }
            pcVar9 = "";
            if (1 < iVar7) {
              pcVar9 = " that you dipped into";
            }
            pline("The %spotion%s %s.",local_398,pcVar9,&local_198);
            if (((objects[sVar1].oc_uname == (char *)0x0) && ((uVar6 & 0x20) != 0)) &&
               ((objects[sVar1].field_0x10 & 1) == 0)) {
              poVar11 = &zeroobj;
              poVar20 = &local_98;
              for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
                poVar20->nobj = poVar11->nobj;
                poVar11 = (obj *)((long)poVar11 + ((ulong)bVar22 * -2 + 1) * 8);
                poVar20 = (obj *)((long)poVar20 + (ulong)bVar22 * -0x10 + 8);
              }
              local_98._74_1_ = local_98._74_1_ | 0x20;
              local_98.otyp = local_41a;
              local_98.oclass = '\b';
              docall(&local_98);
            }
          }
          else {
LAB_00222572:
            if (ublindf != (obj *)0x0) {
LAB_00222577:
              if (ublindf->oartifact == '\x1d') goto LAB_002225a6;
            }
            *(uint *)&poVar8->field_0x4a = uVar5 & 0xffffff9f;
          }
          obj_extract_self(poVar8);
          pcVar9 = doname(poVar8);
          hold_another_object(poVar8,"You juggle and drop %s!",pcVar9,(char *)0x0);
LAB_00222aaa:
          update_inventory();
          return 1;
        }
LAB_00222251:
        uVar6 = *(uint *)&local_428->field_0x4a;
        if ((uVar6 >> 0x13 & 1) == 0) {
          if ((uVar6 & 1) != 0) {
            pcVar9 = body_part(3);
            pcVar9 = makeplural(pcVar9);
            pline("The potion spills and covers your %s with oil.",pcVar9);
            iVar7 = 2;
            iVar16 = -2;
            do {
              uVar6 = mt_random();
              iVar7 = iVar7 + uVar6 % 10;
              iVar16 = iVar16 + 1;
            } while (iVar16 != 0);
            uVar6 = (u.uprops[0x29].intrinsic & 0xffffff) + iVar7;
            if (0xfffffe < uVar6) {
              uVar6 = 0xffffff;
            }
            u.uprops[0x29].intrinsic = u.uprops[0x29].intrinsic & 0xff000000 | uVar6;
            goto LAB_00222387;
          }
          if (cVar3 != '\x02') {
            if (cVar3 == '\x06') {
              uVar17 = local_430->otyp;
              lVar15 = (long)(short)uVar17;
              if (objects[lVar15].oc_subtyp != '\0') goto LAB_0022268b;
            }
            else {
              uVar17 = local_430->otyp;
            }
            if ((uVar17 & 0xfffe) == 0xe8) {
              if ((local_430->field_0x4c & 8) != 0) {
                useup(local_428);
                iVar16 = (int)u.ux;
                y = (int)u.uy;
                iVar7 = 6;
                iVar21 = -6;
                do {
                  uVar6 = mt_random();
                  iVar7 = iVar7 + uVar6 % 6;
                  iVar21 = iVar21 + 1;
                } while (iVar21 != 0);
                explode(iVar16,y,0xb,iVar7,'\0',5);
                exercise(2,'\0');
                return 1;
              }
              if ((uVar17 == 0xe9) && (local_430->spe == '\0')) {
                local_430->otyp = 0xe8;
                local_430->age = 0;
              }
              if (local_430->age < 0x3e9) {
                pcVar9 = yname(local_430);
                pline("You fill %s with oil.",pcVar9);
                check_unpaid(local_428);
                iVar7 = local_428->age * 2 + local_430->age;
                if (0x5db < iVar7) {
                  iVar7 = 0x5dc;
                }
                local_430->age = iVar7;
                useup(local_428);
                exercise(2,'\x01');
              }
              else {
                pcVar9 = Yname2(local_430);
                pcVar10 = otense(local_430,"are");
                pline("%s %s full.",pcVar9,pcVar10);
                *(uint *)&local_428->field_0x4a = *(uint *)&local_428->field_0x4a & 0xff7fffff;
              }
              discover_object(0x142,'\x01','\x01');
              local_430->spe = '\x01';
              goto LAB_00222aaa;
            }
            goto LAB_0022241b;
          }
          lVar15 = (long)local_430->otyp;
LAB_0022268b:
          uVar17 = *(ushort *)&objects[lVar15].field_0x11 >> 4 & 0x1f;
          if (((uVar17 != 0xd) && (uVar17 != 0xb)) ||
             (((cVar3 == '\x02' && ((byte)(objects[lVar15].oc_subtyp + 0x18U) < 3)) ||
              ((local_430->field_0x4b & 0xf) == 0)))) {
            pcVar9 = Yname2(local_430);
            pcVar10 = otense(local_430,"gleam");
            pcVar19 = "%s %s with an oily sheen.";
            goto LAB_0022278a;
          }
          pcVar9 = Yname2(local_430);
          pcVar10 = otense(local_430,"are");
          pcVar19 = "corroded and rusty";
          if ((*(uint *)&local_430->field_0x4a & 0xc00) == 0) {
            pcVar19 = "rusty";
          }
          pcVar14 = "corroded";
          if ((*(uint *)&local_430->field_0x4a & 0x300) != 0) {
            pcVar14 = pcVar19;
          }
          pline("%s %s less %s.",pcVar9,pcVar10,pcVar14);
          uVar6 = *(uint *)&local_430->field_0x4a;
          if ((uVar6 & 0x300) != 0) {
            uVar6 = uVar6 & 0xfffffcff | uVar6 + 0x300 & 0x300;
            *(uint *)&local_430->field_0x4a = uVar6;
          }
          bVar2 = '\x01';
          if ((uVar6 & 0xc00) != 0) {
            *(uint *)&local_430->field_0x4a = uVar6 & 0xfffff3ff | uVar6 + 0xc00 & 0xc00;
          }
        }
        else {
          uVar17 = *(ushort *)&objects[local_430->otyp].field_0x11;
          bVar2 = catch_lit(local_430);
          if (bVar2 == '\0') {
            if (((((local_430->field_0x4b & 0x10) != 0) ||
                 (bVar2 = obj_resists(local_430,5,0x5f), bVar2 != '\0')) ||
                (bVar2 = is_flammable(local_430), bVar2 == '\0')) || (local_430->oclass == '\a')) {
              pcVar9 = Yname2(local_430);
              pcVar10 = otense(local_430,"seem");
              pcVar19 = "%s %s to burn for a moment.";
LAB_0022278a:
              bVar2 = '\0';
              pline(pcVar19,pcVar9,pcVar10);
              goto LAB_0022279a;
            }
            uVar17 = uVar17 >> 4 & 0x1f;
            if (((uVar17 == 0x12) || (uVar17 == 5)) && (local_430->oartifact == '\0')) {
              local_430->field_0x4b = local_430->field_0x4b | 3;
            }
            pcVar9 = "damages";
            if ((~*(uint *)&local_430->field_0x4a & 0x300) == 0) {
              pcVar9 = "destroys";
            }
            pcVar10 = yname(local_430);
            pline("The burning oil %s %s.",pcVar9,pcVar10);
            uVar6 = *(uint *)&local_430->field_0x4a;
            if ((~uVar6 & 0x300) == 0) {
              obj_extract_self(local_430);
              bVar2 = '\0';
              obfree(local_430,(obj *)0x0);
              local_430 = (obj *)0x0;
              goto LAB_0022279a;
            }
            if ((uVar6 & 4) != 0) {
              verbalize("You burnt it, you bought it!");
              bill_dummy_object(local_430);
              uVar6 = *(uint *)&local_430->field_0x4a;
            }
            *(uint *)&local_430->field_0x4a = uVar6 & 0xfffffcff | uVar6 + 0x100 & 0x300;
          }
LAB_00222387:
          bVar2 = '\0';
        }
LAB_0022279a:
        exercise(2,bVar2);
        discover_object((int)local_428->otyp,'\x01','\x01');
        potion = local_428;
        goto LAB_002227c5;
      }
      sVar4 = (short)*(undefined4 *)&local_430->field_0x4a;
      if (uVar17 != 0x13f) {
        if (-1 < sVar4) goto LAB_00222245;
        if (uVar17 < 0x136) {
          if ((uVar17 == 300) || (uVar17 == 0x131)) {
LAB_002228d6:
            pcVar9 = xname(local_430);
            pcVar9 = the(pcVar9);
            pline("A coating wears off %s.",pcVar9);
            *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a & 0xffff7fff;
            goto LAB_00222068;
          }
        }
        else {
          if (uVar17 == 0x142) goto LAB_00222251;
          if (uVar17 == 0x136) goto LAB_002228d6;
        }
        goto LAB_00222418;
      }
      if (sVar4 < 0) goto LAB_00222418;
      iVar7 = local_428->quan;
      pcVar9 = xname(local_428);
      if (iVar7 < 2) {
        pcVar9 = The(pcVar9);
        strcpy(local_398,pcVar9);
      }
      else {
        pcVar9 = the(pcVar9);
        sprintf(local_398,"One of %s",pcVar9);
      }
      pcVar9 = xname(local_430);
      pcVar9 = the(pcVar9);
      pline("%s forms a coating on %s.",local_398,pcVar9);
      *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a | 0x8000;
    }
  }
  else {
    if ((*(uint *)&local_430->field_0x4a & 1) == 0) {
      if ((*(uint *)&local_430->field_0x4a & 2) != 0) goto LAB_00221e64;
      if (!bVar12) {
        pcVar9 = hcolor("light blue");
        pcVar10 = aobjnam(local_430,"softly glow");
        pcVar19 = strchr("aeiouAEIOU",(int)*pcVar9);
        pcVar14 = "n";
        if (pcVar19 == (char *)0x0) {
          pcVar14 = "";
        }
        pline("%s %s with a%s %s aura.",local_298,pcVar10,pcVar14,pcVar9);
      }
      bless(local_430);
    }
    else {
      if (!bVar12) {
        pcVar9 = aobjnam(local_430,"softly glow");
        pcVar10 = hcolor("amber");
        pline("%s %s %s.",local_298,pcVar9,pcVar10);
      }
      uncurse(local_430);
    }
LAB_0022205f:
    *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a | 0x40;
  }
LAB_00222068:
  potion = local_428;
  if (((objects[local_428->otyp].field_0x10 & 1) == 0) &&
     (objects[local_428->otyp].oc_uname == (char *)0x0)) {
    docall(local_428);
    potion = local_428;
  }
LAB_002227c5:
  useup(potion);
  return 1;
}

Assistant:

int dodip(struct obj *potion)
{
	struct obj *obj;
	const char *tmp;
	uchar here;
	char allowall[2] = {ALL_CLASSES, 0};
	char qbuf[QBUFSZ];

	if (potion && !validate_object(potion, beverages, "dip into"))
		return 0;
	
	obj = getobj(allowall, "dip", NULL);
	if (!obj) return 0;

	if (!potion) {
		here = level->locations[u.ux][u.uy].typ;
		/* Is there a fountain to dip into here? */
		if (IS_FOUNTAIN(here)) {
			sprintf(qbuf, "Dip %s into the fountain?",
				safe_qbuf("", sizeof("Dip  into the fountain?"),
					  the(xname(obj)),
					  the(simple_typename(obj->otyp)),
					  "this item"));
			if (yn(qbuf) == 'y') {
				dipfountain(obj);
				return 1;
			}
		} else if (is_pool(level, u.ux,u.uy) || is_swamp(level, u.ux,u.uy)) {
			tmp = waterbody_name(u.ux,u.uy);
			sprintf(qbuf, "Dip %s into the %s?",
				safe_qbuf("",
					  sizeof("Dip  into the pool of water?"),
					  the(xname(obj)),
					  the(simple_typename(obj->otyp)),
					  "this item"),
				tmp);
			if (yn(qbuf) == 'y') {
			    if (Levitation) {
				floating_above(tmp);
			    } else if (u.usteed && !is_swimmer(u.usteed->data) &&
				    P_SKILL(P_RIDING) < P_BASIC) {
				rider_cant_reach(); /* not skilled enough to reach */
			    } else {
				get_wet(obj);
				if (obj->otyp == POT_ACID) useup(obj);
			    }
			    return 1;
			}
		}
		sprintf(qbuf, "dip %s into",
			safe_qbuf("", sizeof("dip  into"),
				  the(xname(obj)),
				  the(simple_typename(obj->otyp)),
				  "this item"));
		potion = getobj(beverages, qbuf, NULL);
	}

	if (!potion) return 0;
	if (potion == obj && potion->quan == 1L) {
		pline("That is a potion bottle, not a Klein bottle!");
		return 0;
	}

	return dip(potion, obj);
}